

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_CheckArmorType
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *this;
  VMValue *pVVar1;
  bool bVar2;
  bool local_69;
  bool local_5b;
  FName local_54;
  int u;
  ABasicArmor *armor;
  int amount;
  FName type;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x4d2,
                  "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x4d2,
                  "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  _amount = (AActor *)(param->field_0).field_1.a;
  local_5b = true;
  if (_amount != (AActor *)0x0) {
    local_5b = DObject::IsKindOf((DObject *)_amount,AActor::RegistrationInfo.MyClass);
  }
  if (local_5b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x4d2,
                  "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x4d3,
                  "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x4d3,
                  "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  FName::FName((FName *)((long)&armor + 4),param[1].field_0.i);
  if (numparam < 3) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x4d4,
                    "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    armor._0_4_ = (pVVar1->field_0).i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x4d4,
                    "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    armor._0_4_ = param[2].field_0.i;
  }
  this = _amount;
  FName::FName(&local_54,NAME_BasicArmor);
  _u = AActor::FindInventory(this,&local_54);
  local_69 = false;
  if (_u != (AInventory *)0x0) {
    bVar2 = FName::operator==((FName *)((long)&_u[1].super_AActor.super_DThinker.super_DObject.
                                               ObjNext + 4),(FName *)((long)&armor + 4));
    local_69 = false;
    if (bVar2) {
      local_69 = (int)armor <= _u->Amount;
    }
  }
  if (numret < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x4d8,
                    "int AF_AActor_CheckArmorType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    VMReturn::SetInt(ret,(uint)local_69);
    param_local._4_4_ = 1;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckArmorType)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME	 (type);
	PARAM_INT_DEF(amount);

	ABasicArmor *armor = (ABasicArmor *)self->FindInventory(NAME_BasicArmor);

	ACTION_RETURN_BOOL(armor && armor->ArmorType == type && armor->Amount >= amount);
}